

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  
  fVar4 = (window->Pos).x;
  fVar1 = (window->Size).x + fVar4;
  fVar5 = (window->Pos).y;
  fVar2 = (window->Size).y + fVar5;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar1 = fVar1 + -1.0;
    fVar2 = fVar2 + -1.0;
  }
  switch(border_n) {
  case 0:
    break;
  case 1:
    fVar3 = fVar1 - thickness;
    fVar6 = fVar5 + perp_padding;
    fVar4 = thickness + fVar1;
    fVar2 = fVar2 - perp_padding;
    goto LAB_001e88ab;
  case 2:
    fVar5 = fVar2;
    break;
  case 3:
    fVar3 = fVar4 - thickness;
    fVar6 = fVar5 + perp_padding;
    fVar4 = fVar4 + thickness;
    fVar2 = fVar2 - perp_padding;
    goto LAB_001e88ab;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1351,"ImRect GetResizeBorderRect(ImGuiWindow *, int, float, float)");
  }
  fVar3 = fVar4 + perp_padding;
  fVar6 = fVar5 - thickness;
  fVar4 = fVar1 - perp_padding;
  fVar2 = fVar5 + thickness;
LAB_001e88ab:
  IVar7.Max.y = fVar2;
  IVar7.Max.x = fVar4;
  IVar7.Min.y = fVar6;
  IVar7.Min.x = fVar3;
  return IVar7;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1,1);
    if (border_n == 0) return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);      // Top
    if (border_n == 1) return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding);   // Right
    if (border_n == 2) return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);      // Bottom
    if (border_n == 3) return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding);   // Left
    IM_ASSERT(0);
    return ImRect();
}